

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O0

_Bool hashmap_scan(hashmap *map,_func__Bool_void_ptr_void_ptr *iter,void *udata)

{
  _Bool _Var1;
  bucket *entry;
  void *pvVar2;
  bucket *bucket;
  size_t i;
  void *udata_local;
  _func__Bool_void_ptr_void_ptr *iter_local;
  hashmap *map_local;
  
  bucket = (bucket *)0x0;
  do {
    if ((bucket *)map->nbuckets <= bucket) {
      return true;
    }
    entry = bucket_at(map,(size_t)bucket);
    if (SUB82(*entry,6) != 0) {
      pvVar2 = bucket_item(entry);
      _Var1 = (*iter)(pvVar2,udata);
      if (!_Var1) {
        return false;
      }
    }
    bucket = (bucket *)&bucket->field_0x1;
  } while( true );
}

Assistant:

bool hashmap_scan(struct hashmap *map, 
    bool (*iter)(const void *item, void *udata), void *udata)
{
    for (size_t i = 0; i < map->nbuckets; i++) {
        struct bucket *bucket = bucket_at(map, i);
        if (bucket->dib && !iter(bucket_item(bucket), udata)) {
            return false;
        }
    }
    return true;
}